

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

int32 limit_xm_getnc(char *ptr,int32 n,void *f)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = *(long *)((long)f + 8);
  uVar2 = (int)*(undefined8 *)((long)f + 0x18) - (int)lVar1;
  if (n - uVar2 == 0 || n < (int)uVar2) {
    memcpy(ptr,(void *)(lVar1 + *f),(long)n);
  }
  else if ((int)uVar2 < 1) {
    memset(ptr,0,(long)n);
  }
  else {
    memcpy(ptr,(void *)(lVar1 + *f),(ulong)(uVar2 & 0x7fffffff));
    memset(ptr + (uVar2 & 0x7fffffff),0,(long)(int)(n - uVar2));
  }
  *(long *)((long)f + 8) = *(long *)((long)f + 8) + (long)n;
  return n;
}

Assistant:

static int32 DUMBCALLBACK limit_xm_getnc(char *ptr, int32 n, void *f)
{
	LIMITED_XM *lx = f;
	int left;
	left = lx->allocated - lx->ptr;
	if (n > left) {
		if (left > 0) {
			memcpy( ptr, lx->buffered + lx->ptr, left );
			memset( ptr + left, 0, n - left );
		} else {
			memset( ptr, 0, n );
		}
	} else {
		memcpy( ptr, lx->buffered + lx->ptr, n );
	}
	lx->ptr += n;
	return n;
}